

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v128_intrinsics_c.h
# Opt level: O3

c_v128 c_v128_pack_s32_u16(c_v128 a,c_v128 b)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  c_v128 cVar10;
  
  uVar9 = a.s32[3];
  if (uVar9 == 0 || a.s64[1] < 0) {
    uVar9 = 0;
  }
  if (0xfffe < (int)uVar9) {
    uVar9 = 0xffff;
  }
  uVar6 = 0;
  if (0 < (int)a.s32[2]) {
    uVar6 = a.s32[2];
  }
  if (0xfffe < (int)uVar6) {
    uVar6 = 0xffff;
  }
  uVar1 = a.s32[1];
  if (uVar1 == 0 || a.s64[0] < 0) {
    uVar1 = 0;
  }
  if (0xfffe < (int)uVar1) {
    uVar1 = 0xffff;
  }
  uVar2 = 0;
  if (0 < (int)a.s32[0]) {
    uVar2 = a.s32[0];
  }
  if (0xfffe < (int)uVar2) {
    uVar2 = 0xffff;
  }
  uVar4 = b.s32[3];
  if (uVar4 == 0 || b.s64[1] < 0) {
    uVar4 = 0;
  }
  uVar8 = 0xffff;
  uVar5 = (ulong)uVar4;
  if (0xfffe < (int)uVar4) {
    uVar5 = 0xffff;
  }
  uVar4 = 0;
  if (0 < (int)b.s32[2]) {
    uVar4 = b.s32[2];
  }
  if (0xfffe < (int)uVar4) {
    uVar4 = uVar8;
  }
  uVar3 = b.s32[1];
  if (uVar3 == 0 || b.s64[0] < 0) {
    uVar3 = 0;
  }
  if (0xfffe < (int)uVar3) {
    uVar3 = uVar8;
  }
  uVar7 = 0;
  if (0 < (int)b.s32[0]) {
    uVar7 = b.s32[0];
  }
  if (0xfffe < (int)uVar7) {
    uVar7 = uVar8;
  }
  cVar10._0_8_ = (ulong)uVar4 << 0x20 | uVar5 << 0x30 | (ulong)(uVar3 << 0x10) | (ulong)uVar7;
  cVar10.u64[1] =
       (ulong)uVar6 << 0x20 | (ulong)uVar9 << 0x30 | (ulong)(uVar1 << 0x10) | (ulong)uVar2;
  return cVar10;
}

Assistant:

SIMD_INLINE c_v128 c_v128_pack_s32_u16(c_v128 a, c_v128 b) {
  return c_v128_from_v64(c_v64_pack_s32_u16(a.v64[1], a.v64[0]),
                         c_v64_pack_s32_u16(b.v64[1], b.v64[0]));
}